

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::ubo::anon_unknown_0::UniformBlockCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,UniformBlockCaseInstance *this)

{
  pointer pVVar1;
  VkRenderPass *pVVar2;
  deUint32 *pdVar3;
  Context *pCVar4;
  undefined8 *puVar5;
  _Base_ptr p_Var6;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var7;
  TestLog *pTVar8;
  undefined8 uVar9;
  VkPipelineLayout obj;
  undefined8 uVar10;
  Handle<(vk::HandleType)17> HVar11;
  Handle<(vk::HandleType)17> HVar12;
  deUint32 dVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  VkShaderModule VVar20;
  undefined8 obj_00;
  ChannelOrder CVar21;
  deUint32 dVar22;
  VkResult VVar23;
  DeviceInterface *pDVar24;
  VkDevice pVVar25;
  VkQueue pVVar26;
  InstanceInterface *pIVar27;
  VkPhysicalDevice pVVar28;
  Allocator *pAVar29;
  DeviceInterface *pDVar30;
  VkDevice pVVar31;
  DescriptorPoolBuilder *this_00;
  _Base_ptr p_Var32;
  uint *puVar33;
  mapped_type *pmVar34;
  const_iterator cVar35;
  _Base_ptr p_Var36;
  Surface *surface_00;
  void *__buf;
  uint uVar37;
  uint uVar38;
  int iVar39;
  pointer pBVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  void *data;
  long lVar44;
  uint uVar45;
  ulong uVar46;
  deUint32 queueFamilyIndex;
  ChannelType CStack_7a4;
  undefined1 auStack_7a0 [16];
  char acStack_790 [4];
  char acStack_78c [4];
  void *local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  DeviceInterface *local_768;
  VkDevice local_760;
  VkRenderPassBeginInfo passBeginInfo;
  VkAttachmentReference attachmentReference;
  Move<vk::Handle<(vk::HandleType)17>_> local_6c8;
  Surface *local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  deUint32 local_68c;
  Surface surface;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> descriptors;
  long local_638;
  long *plStack_630;
  VkPhysicalDeviceType local_628;
  char cStack_624;
  char cStack_623;
  char cStack_622;
  char cStack_621;
  char acStack_620 [8];
  VkImage local_618;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_610;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyStateParams;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_5d0;
  VkQueue local_5b0;
  VkStructureType local_5a8;
  undefined4 uStack_5a4;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_5a0;
  TextureFormat local_588;
  Deleter<vk::Handle<(vk::HandleType)19>_> DStack_580;
  VkBuffer local_568;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_560;
  VkBuffer local_548;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_540;
  VkPhysicalDeviceProperties properties;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_1e0;
  VkShaderModule local_1c8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_1c0;
  VkShaderModule local_1a8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_1a0;
  VkFramebuffer local_188;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_180;
  VkDescriptorPool local_168;
  Deleter<vk::Handle<(vk::HandleType)21>_> DStack_160;
  TextureFormat local_148;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_140;
  VkPipelineViewportStateCreateInfo viewportStateParams;
  VkClearValue clearValue;
  VkDevice local_e8;
  VkAllocationCallbacks *pVStack_e0;
  VkVertexInputAttributeDescription vertexAttribute;
  VkDeviceSize offsets [1];
  VkVertexInputBindingDescription vertexBinding;
  VkRect2D scissor;
  VkCommandBufferBeginInfo beginInfo;
  VkDescriptorSetAllocateInfo descriptorSetAllocateInfo;
  
  pDVar24 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar25 = Context::getDevice((this->super_TestInstance).m_context);
  pVVar26 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  local_68c = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,
               (this->super_TestInstance).m_context,0x40,0x80);
  DStack_540.m_device = (VkDevice)properties._16_8_;
  DStack_540.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_548.m_internal._0_4_ = properties.apiVersion;
  local_548.m_internal._4_4_ = properties.driverVersion;
  DStack_540.m_deviceIface = (DeviceInterface *)properties._8_8_;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties,
             (this->super_TestInstance).m_context,(VkBuffer)properties._0_8_,(MemoryRequirement)0x1)
  ;
  uVar14 = properties._0_8_;
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,
               (this->super_TestInstance).m_context,0x18,0xc0);
  DStack_560.m_device = (VkDevice)properties._16_8_;
  DStack_560.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_568.m_internal._0_4_ = properties.apiVersion;
  local_568.m_internal._4_4_ = properties.driverVersion;
  DStack_560.m_deviceIface = (DeviceInterface *)properties._8_8_;
  local_5b0 = pVVar26;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties,
             (this->super_TestInstance).m_context,(VkBuffer)properties._0_8_,(MemoryRequirement)0x1)
  ;
  uVar15 = properties._0_8_;
  pCVar4 = (this->super_TestInstance).m_context;
  pIVar27 = Context::getInstanceInterface(pCVar4);
  pVVar28 = Context::getPhysicalDevice(pCVar4);
  (*pIVar27->_vptr_InstanceInterface[5])(pIVar27,pVVar28,&properties);
  puVar5 = *(undefined8 **)(uVar14 + 0x18);
  puVar5[6] = 0x3f8000003f800000;
  puVar5[7] = 0x3f80000000000000;
  puVar5[4] = 0xbf8000003f800000;
  puVar5[5] = 0x3f80000000000000;
  puVar5[2] = 0x3f800000bf800000;
  puVar5[3] = 0x3f80000000000000;
  *puVar5 = 0xbf800000bf800000;
  puVar5[1] = 0x3f80000000000000;
  ::vk::flushMappedMemoryRange
            (pDVar24,pVVar25,(VkDeviceMemory)*(deUint64 *)(uVar14 + 8),
             *(VkDeviceSize *)(uVar14 + 0x10),0x40);
  puVar5 = *(undefined8 **)(uVar15 + 0x18);
  *puVar5 = 0x100000000;
  puVar5[1] = 0x200000002;
  puVar5[2] = 0x300000001;
  ::vk::flushMappedMemoryRange
            (pDVar24,pVVar25,(VkDeviceMemory)*(deUint64 *)(uVar15 + 8),
             *(VkDeviceSize *)(uVar15 + 0x10),0x18);
  pCVar4 = (this->super_TestInstance).m_context;
  local_768 = pDVar24;
  local_760 = pVVar25;
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(pCVar4);
  properties.deviceName._52_8_ = &queueFamilyIndex;
  properties.apiVersion = 0xe;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\x01';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '%';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = 'd';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  properties.deviceName[0xc] = 'd';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x10] = '\x01';
  properties.deviceName[0x11] = '\0';
  properties.deviceName[0x12] = '\0';
  properties.deviceName[0x13] = '\0';
  properties.deviceName[0x14] = '\x01';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\x01';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName[0x1c] = '\x01';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x11';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceName[0x2c] = '\x01';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  properties.deviceName._60_8_ = (ulong)(uint)properties.deviceName._64_4_ << 0x20;
  pDVar24 = Context::getDeviceInterface(pCVar4);
  pVVar25 = Context::getDevice(pCVar4);
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&passBeginInfo,pDVar24,pVVar25,
                    (VkImageCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
  uVar10 = passBeginInfo._0_8_;
  local_618.m_internal = passBeginInfo._0_8_;
  DStack_610.m_deviceIface = (DeviceInterface *)passBeginInfo.pNext;
  DStack_610.m_device = (VkDevice)passBeginInfo.renderPass.m_internal;
  DStack_610.m_allocator = (VkAllocationCallbacks *)passBeginInfo.framebuffer.m_internal;
  pCVar4 = (this->super_TestInstance).m_context;
  pDVar24 = Context::getDeviceInterface(pCVar4);
  pVVar25 = Context::getDevice(pCVar4);
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&properties,pDVar24,pVVar25,(VkImage)uVar10);
  pAVar29 = Context::getDefaultAllocator(pCVar4);
  (*pAVar29->_vptr_Allocator[3])(&passBeginInfo,pAVar29,&properties,0);
  pVVar25 = Context::getDevice(pCVar4);
  (*pDVar24->_vptr_DeviceInterface[0xd])
            (pDVar24,pVVar25,uVar10,*(undefined8 *)(passBeginInfo._0_8_ + 8));
  uVar10 = passBeginInfo._0_8_;
  pCVar4 = (this->super_TestInstance).m_context;
  properties.apiVersion = 0xf;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties._16_8_ = properties._16_8_ & 0xffffffff00000000;
  properties.deviceName[4] = (undefined1)local_618.m_internal;
  properties.deviceName[5] = local_618.m_internal._1_1_;
  properties.deviceName[6] = local_618.m_internal._2_1_;
  properties.deviceName[7] = local_618.m_internal._3_1_;
  properties.deviceName[8] = local_618.m_internal._4_1_;
  properties.deviceName[9] = local_618.m_internal._5_1_;
  properties.deviceName[10] = local_618.m_internal._6_1_;
  properties.deviceName[0xb] = local_618.m_internal._7_1_;
  properties.deviceName[0xc] = '\x01';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x10] = '%';
  properties.deviceName[0x11] = '\0';
  properties.deviceName[0x12] = '\0';
  properties.deviceName[0x13] = '\0';
  properties.deviceName[0x14] = '\x03';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\x04';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName[0x1c] = '\x05';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\x06';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x01';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceName[0x2c] = '\x01';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  properties.deviceName[0x30] = '\0';
  properties.deviceName[0x31] = '\0';
  properties.deviceName[0x32] = '\0';
  properties.deviceName[0x33] = '\0';
  properties.deviceName[0x34] = '\x01';
  properties.deviceName[0x35] = '\0';
  properties.deviceName[0x36] = '\0';
  properties.deviceName[0x37] = '\0';
  pDVar24 = Context::getDeviceInterface(pCVar4);
  pVVar25 = Context::getDevice(pCVar4);
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&passBeginInfo,pDVar24,pVVar25,
             (VkImageViewCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
  local_148.order = passBeginInfo.sType;
  local_148.type = passBeginInfo._4_4_;
  DStack_140.m_deviceIface = (DeviceInterface *)passBeginInfo.pNext;
  DStack_140.m_device = (VkDevice)passBeginInfo.renderPass.m_internal;
  DStack_140.m_allocator = (VkAllocationCallbacks *)passBeginInfo.framebuffer.m_internal;
  uVar45 = (int)((long)(this->m_layout->blocks).
                       super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_layout->blocks).
                       super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
  queueFamilyIndex = R;
  CStack_7a4 = SNORM_INT8;
  auStack_7a0._0_4_ = R;
  auStack_7a0._4_4_ = SNORM_INT8;
  auStack_7a0._8_4_ = R;
  auStack_7a0._12_4_ = SNORM_INT8;
  if (0 < (int)uVar45) {
    uVar46 = (ulong)(uVar45 & 0x7fffffff);
    iVar39 = -1;
    lVar44 = 0x44;
    do {
      pBVar40 = (this->m_layout->blocks).
                super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)&(pBVar40->name)._M_dataplus._M_p + lVar44) == iVar39) {
        *(int *)(auStack_7a0._0_8_ + -4) = *(int *)(auStack_7a0._0_8_ + -4) + 1;
      }
      else {
        properties.apiVersion = 1;
        if (auStack_7a0._0_8_ == auStack_7a0._8_8_) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&queueFamilyIndex,
                     (iterator)auStack_7a0._0_8_,(int *)&properties);
        }
        else {
          *(int *)auStack_7a0._0_8_ = 1;
          auStack_7a0._0_8_ = auStack_7a0._0_8_ + 4;
        }
        iVar39 = *(int *)((long)&(pBVar40->name)._M_dataplus._M_p + lVar44);
      }
      lVar44 = lVar44 + 0x50;
      uVar46 = uVar46 - 1;
    } while (uVar46 != 0);
  }
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder
            ((DescriptorSetLayoutBuilder *)&properties);
  pVVar25 = local_760;
  pDVar24 = local_768;
  if ((TextureFormat)auStack_7a0._0_8_ != _queueFamilyIndex) {
    uVar46 = 0;
    do {
      dVar22 = *(deUint32 *)((long)_queueFamilyIndex + uVar46 * 4);
      if ((int)dVar22 < 2) {
        dVar22 = 1;
      }
      ::vk::DescriptorSetLayoutBuilder::addBinding
                ((DescriptorSetLayoutBuilder *)&properties,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,dVar22,
                 0x7fffffff,(VkSampler *)0x0);
      uVar46 = uVar46 + 1;
    } while (uVar46 < (ulong)(auStack_7a0._0_8_ - (long)_queueFamilyIndex >> 2));
  }
  pDVar30 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar31 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&passBeginInfo,
             (DescriptorSetLayoutBuilder *)&properties,pDVar30,pVVar31,0);
  if (properties.deviceName._28_8_ != 0) {
    operator_delete((void *)properties.deviceName._28_8_,
                    properties.deviceName._44_8_ - properties.deviceName._28_8_);
  }
  if (properties.deviceName._4_8_ != 0) {
    operator_delete((void *)properties.deviceName._4_8_,
                    properties.deviceName._20_8_ - properties.deviceName._4_8_);
  }
  if (properties._0_8_ != 0) {
    operator_delete((void *)properties._0_8_,properties._16_8_ - properties._0_8_);
  }
  if (_queueFamilyIndex != (TextureFormat)0x0) {
    operator_delete((void *)_queueFamilyIndex,auStack_7a0._8_8_ - (long)_queueFamilyIndex);
  }
  local_588.order = passBeginInfo.sType;
  local_588.type = passBeginInfo._4_4_;
  DStack_580.m_deviceIface = (DeviceInterface *)passBeginInfo.pNext;
  DStack_580.m_device = (VkDevice)passBeginInfo.renderPass.m_internal;
  DStack_580.m_allocator = (VkAllocationCallbacks *)passBeginInfo.framebuffer.m_internal;
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&passBeginInfo);
  this_00 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&passBeginInfo,VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
                       (int)((ulong)((long)(this->m_layout->blocks).
                                           super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(this->m_layout->blocks).
                                          super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                       -0x33333333);
  pDVar30 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  pVVar31 = Context::getDevice((this->super_TestInstance).m_context);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&properties,this_00,pDVar30,pVVar31,1,1);
  if (passBeginInfo._0_8_ != 0) {
    operator_delete((void *)passBeginInfo._0_8_,
                    passBeginInfo.renderPass.m_internal - passBeginInfo._0_8_);
  }
  local_168.m_internal._0_4_ = properties.apiVersion;
  local_168.m_internal._4_4_ = properties.driverVersion;
  DStack_160.m_deviceIface = (DeviceInterface *)properties._8_8_;
  DStack_160.m_device = (VkDevice)properties._16_8_;
  DStack_160.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  descriptorSetAllocateInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  descriptorSetAllocateInfo.pNext = (void *)0x0;
  descriptorSetAllocateInfo.descriptorPool.m_internal._0_4_ = properties.apiVersion;
  descriptorSetAllocateInfo.descriptorPool.m_internal._4_4_ = properties.driverVersion;
  descriptorSetAllocateInfo.descriptorSetCount = 1;
  descriptorSetAllocateInfo.pSetLayouts = (VkDescriptorSetLayout *)&local_588;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&properties,pDVar24,pVVar25,
             &descriptorSetAllocateInfo);
  local_628 = properties.deviceType;
  cStack_624 = properties.deviceName[0];
  cStack_623 = properties.deviceName[1];
  cStack_622 = properties.deviceName[2];
  cStack_621 = properties.deviceName[3];
  acStack_620[0] = properties.deviceName[4];
  acStack_620[1] = properties.deviceName[5];
  acStack_620[2] = properties.deviceName[6];
  acStack_620[3] = properties.deviceName[7];
  acStack_620[4] = properties.deviceName[8];
  acStack_620[5] = properties.deviceName[9];
  acStack_620[6] = properties.deviceName[10];
  acStack_620[7] = properties.deviceName[0xb];
  local_638._0_4_ = properties.apiVersion;
  local_638._4_4_ = properties.driverVersion;
  plStack_630 = (long *)properties._8_8_;
  uVar45 = (int)((long)(this->m_layout->blocks).
                       super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_layout->blocks).
                       super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x33333333;
  std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
            (&descriptors,(long)(int)uVar45,(allocator_type *)&properties);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&properties);
  if (this->m_bufferMode == BUFFERMODE_PER_BLOCK) {
    if (0 < (int)uVar45) {
      uVar46 = 0;
      do {
        p_Var32 = &(this->m_blockPointers->_M_t)._M_impl.super__Rb_tree_header._M_header;
        p_Var36 = p_Var32;
        for (p_Var6 = (this->m_blockPointers->_M_t)._M_impl.super__Rb_tree_header._M_header.
                      _M_parent; p_Var6 != (_Base_ptr)0x0;
            p_Var6 = (&p_Var6->_M_left)[(long)(int)p_Var6[1]._M_color < (long)uVar46]) {
          if ((long)uVar46 <= (long)(int)p_Var6[1]._M_color) {
            p_Var36 = p_Var6;
          }
        }
        if ((p_Var36 != p_Var32) && ((long)(int)p_Var36[1]._M_color <= (long)uVar46)) {
          p_Var32 = p_Var36;
        }
        pBVar40 = (this->m_layout->blocks).
                  super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        addUniformData((VkDescriptorBufferInfo *)&passBeginInfo,this,pBVar40[uVar46].size,
                       p_Var32[1]._M_parent);
        descriptors.
        super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar46].range = passBeginInfo.renderPass.m_internal
        ;
        descriptors.
        super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar46].buffer.m_internal = passBeginInfo._0_8_;
        descriptors.
        super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar46].offset = (VkDeviceSize)passBeginInfo.pNext;
        ::vk::DescriptorSetUpdateBuilder::write
                  ((DescriptorSetUpdateBuilder *)&properties,(int)local_638,
                   (void *)(ulong)(uint)pBVar40[uVar46].bindingNdx,
                   (ulong)(uint)pBVar40[uVar46].instanceNdx);
        uVar46 = uVar46 + 1;
      } while (uVar46 != (uVar45 & 0x7fffffff));
    }
  }
  else {
    passBeginInfo.framebuffer.m_internal = (deUint64)&passBeginInfo.pNext;
    uVar38 = 0;
    passBeginInfo.pNext = (void *)((ulong)passBeginInfo.pNext & 0xffffffff00000000);
    passBeginInfo.renderPass.m_internal = 0;
    passBeginInfo.renderArea.extent.width = 0;
    passBeginInfo.renderArea.extent.height = 0;
    _queueFamilyIndex = (TextureFormat)((ulong)_queueFamilyIndex & 0xffffffff00000000);
    passBeginInfo.renderArea.offset = (VkOffset2D)passBeginInfo.framebuffer.m_internal;
    if (0 < (int)uVar45) {
      uVar38 = 0;
      do {
        puVar33 = (uint *)std::
                          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                        *)&passBeginInfo,(key_type_conflict *)&queueFamilyIndex);
        uVar37 = (int)properties.limits.minUniformBufferOffsetAlignment + -1 + uVar38 &
                 -(int)properties.limits.minUniformBufferOffsetAlignment;
        if ((int)properties.limits.minUniformBufferOffsetAlignment < 1) {
          uVar37 = uVar38;
        }
        *puVar33 = uVar37;
        uVar38 = uVar37 + (this->m_layout->blocks).
                          super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start[(int)queueFamilyIndex].size;
        CVar21 = queueFamilyIndex + A;
        queueFamilyIndex = CVar21;
      } while ((int)CVar21 < (int)uVar45);
    }
    queueFamilyIndex = R;
    CStack_7a4 = SNORM_INT8;
    auStack_7a0._0_4_ = R;
    auStack_7a0._4_4_ = SNORM_INT8;
    auStack_7a0._8_4_ = R;
    auStack_7a0._12_4_ = SNORM_INT8;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&queueFamilyIndex,
               (ulong)uVar38);
    local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         (ulong)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal.
                _4_4_ << 0x20;
    if (0 < (int)uVar45) {
      do {
        pmVar34 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&passBeginInfo,(key_type_conflict *)&local_6c8);
        p_Var6 = (this->m_blockPointers->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var32 = &(this->m_blockPointers->_M_t)._M_impl.super__Rb_tree_header._M_header;
        p_Var36 = p_Var32;
        for (; p_Var6 != (_Base_ptr)0x0;
            p_Var6 = (&p_Var6->_M_left)
                     [(int)p_Var6[1]._M_color <
                      (int)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                           m_internal]) {
          if ((int)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
              <= (int)p_Var6[1]._M_color) {
            p_Var36 = p_Var6;
          }
        }
        if ((p_Var36 != p_Var32) &&
           ((int)p_Var36[1]._M_color <=
            (int)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal))
        {
          p_Var32 = p_Var36;
        }
        memcpy((void *)((long)*pmVar34 + (long)_queueFamilyIndex),p_Var32[1]._M_parent,
               (long)(this->m_layout->blocks).
                     super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                           m_internal].size);
        iVar39 = (int)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                      m_internal + 1;
        local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_4_ =
             iVar39;
      } while (iVar39 < (int)uVar45);
    }
    addUniformData((VkDescriptorBufferInfo *)&local_6c8,this,uVar38,(void *)_queueFamilyIndex);
    HVar11.m_internal =
         local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
    local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
         local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal &
         0xffffffff00000000;
    if (0 < (int)uVar45) {
      iVar39 = 0;
      do {
        pBVar40 = (this->m_layout->blocks).
                  super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar38 = pBVar40[iVar39].size;
        puVar33 = (uint *)std::
                          map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                          ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                        *)&passBeginInfo,(key_type_conflict *)&local_6c8);
        uVar37 = *puVar33;
        pVVar1 = descriptors.
                 super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (int)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                      m_internal;
        (pVVar1->buffer).m_internal = HVar11.m_internal;
        pVVar1->offset = (ulong)uVar37;
        pVVar1->range = (ulong)uVar38;
        ::vk::DescriptorSetUpdateBuilder::write
                  ((DescriptorSetUpdateBuilder *)&properties,(int)local_638,
                   (void *)(ulong)(uint)pBVar40[iVar39].bindingNdx,
                   (ulong)(uint)pBVar40[iVar39].instanceNdx);
        iVar39 = (int)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
                      m_internal + 1;
        local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_4_ =
             iVar39;
      } while (iVar39 < (int)uVar45);
    }
    if (_queueFamilyIndex != (TextureFormat)0x0) {
      operator_delete((void *)_queueFamilyIndex,auStack_7a0._8_8_ - (long)_queueFamilyIndex);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)&passBeginInfo);
  }
  ::vk::DescriptorSetUpdateBuilder::update
            ((DescriptorSetUpdateBuilder *)&properties,local_768,local_760);
  if (properties.deviceName._28_8_ != 0) {
    operator_delete((void *)properties.deviceName._28_8_,
                    properties.deviceName._44_8_ - properties.deviceName._28_8_);
  }
  if (properties.deviceName._4_8_ != 0) {
    operator_delete((void *)properties.deviceName._4_8_,
                    properties.deviceName._20_8_ - properties.deviceName._4_8_);
  }
  std::
  vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
  ::~vector((vector<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo,_std::allocator<vk::DescriptorSetUpdateBuilder::WriteDescriptorInfo>_>
             *)&properties);
  pVVar25 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar24 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  queueFamilyIndex = R;
  CStack_7a4 = FLOAT_UNSIGNED_INT_24_8_REV;
  auStack_7a0._0_8_ = (DeviceInterface *)0x100000001;
  auStack_7a0._8_8_ = (VkDevice)0x200000000;
  _acStack_790 = (VkAllocationCallbacks *)0x200000001;
  local_788 = (void *)CONCAT44(local_788._4_4_,2);
  properties.deviceName._12_8_ = &attachmentReference;
  attachmentReference.attachment = 0;
  attachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[0x14] = '\0';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\0';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName[0x2c] = '\0';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  properties.deviceName[0x30] = '\0';
  properties.deviceName[0x31] = '\0';
  properties.deviceName[0x32] = '\0';
  properties.deviceName[0x33] = '\0';
  properties.deviceName[0x1c] = '\0';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\0';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceName[4] = '\x01';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  passBeginInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  passBeginInfo.pNext = (void *)0x0;
  passBeginInfo.renderPass.m_internal = 0x100000000;
  passBeginInfo.renderArea.offset.x = 1;
  passBeginInfo.clearValueCount = 0;
  passBeginInfo.pClearValues = (VkClearValue *)0x0;
  passBeginInfo.framebuffer.m_internal = (deUint64)&queueFamilyIndex;
  passBeginInfo.renderArea.extent = (VkExtent2D)&properties;
  ::vk::createRenderPass
            (&local_6c8,pDVar24,pVVar25,(VkRenderPassCreateInfo *)&passBeginInfo,
             (VkAllocationCallbacks *)0x0);
  HVar11.m_internal =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  DStack_5d0.m_deviceIface =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  DStack_5d0.m_device =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  DStack_5d0.m_allocator =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  _queueFamilyIndex = local_148;
  pVVar25 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar24 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  HVar12.m_internal =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  properties.apiVersion = 0x25;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties._16_8_ = properties._16_8_ & 0xffffffff00000000;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_1_ =
       (undefined1)HVar11.m_internal;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._1_1_ =
       SUB81(HVar11.m_internal,1);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._2_1_ =
       SUB81(HVar11.m_internal,2);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._3_1_ =
       SUB81(HVar11.m_internal,3);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._4_1_ =
       SUB81(HVar11.m_internal,4);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._5_1_ =
       SUB81(HVar11.m_internal,5);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._6_1_ =
       SUB81(HVar11.m_internal,6);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._7_1_ =
       SUB81(HVar11.m_internal,7);
  properties.deviceName[4] =
       (undefined1)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
  ;
  properties.deviceName[5] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._1_1_;
  properties.deviceName[6] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._2_1_;
  properties.deviceName[7] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._3_1_;
  properties.deviceName[8] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._4_1_;
  properties.deviceName[9] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._5_1_;
  properties.deviceName[10] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._6_1_;
  properties.deviceName[0xb] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._7_1_;
  properties.deviceName[0xc] = '\x01';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x1c] = 'd';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = 'd';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x01';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       HVar12.m_internal;
  properties.deviceName._20_8_ = &queueFamilyIndex;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&passBeginInfo,pDVar24,pVVar25,
             (VkFramebufferCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
  local_188.m_internal = passBeginInfo._0_8_;
  DStack_180.m_deviceIface = (DeviceInterface *)passBeginInfo.pNext;
  DStack_180.m_device = (VkDevice)passBeginInfo.renderPass.m_internal;
  DStack_180.m_allocator = (VkAllocationCallbacks *)passBeginInfo.framebuffer.m_internal;
  pCVar4 = (this->super_TestInstance).m_context;
  _queueFamilyIndex = local_588;
  properties.apiVersion = 0x1e;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\x01';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName._12_8_ = (ulong)(uint)properties.deviceName._16_4_ << 0x20;
  properties.deviceName[0x14] = '\0';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\0';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName._4_8_ = &queueFamilyIndex;
  pDVar24 = Context::getDeviceInterface(pCVar4);
  pVVar25 = Context::getDevice(pCVar4);
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&passBeginInfo,pDVar24,pVVar25,
             (VkPipelineLayoutCreateInfo *)&properties,(VkAllocationCallbacks *)0x0);
  pVVar2 = &passBeginInfo.renderPass;
  local_5a8 = passBeginInfo.sType;
  uStack_5a4 = passBeginInfo._4_4_;
  DStack_5a0.m_deviceIface._0_4_ = passBeginInfo.pNext._0_4_;
  DStack_5a0.m_deviceIface._4_4_ = passBeginInfo.pNext._4_4_;
  DStack_5a0.m_device._0_4_ = (undefined4)passBeginInfo.renderPass.m_internal;
  DStack_5a0.m_device._4_4_ = passBeginInfo.renderPass.m_internal._4_4_;
  DStack_5a0.m_allocator._0_4_ = (undefined4)passBeginInfo.framebuffer.m_internal;
  DStack_5a0.m_allocator._4_4_ = passBeginInfo.framebuffer.m_internal._4_4_;
  p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  passBeginInfo._0_8_ = pVVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&passBeginInfo,"vert","");
  cVar35 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var7,(key_type *)&passBeginInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&properties,local_768,local_760,
             *(ProgramBinary **)(cVar35._M_node + 2),0);
  DStack_1a0.m_device = (VkDevice)properties._16_8_;
  DStack_1a0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_1a8.m_internal._0_4_ = properties.apiVersion;
  local_1a8.m_internal._4_4_ = properties.driverVersion;
  DStack_1a0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  if ((VkRenderPass *)passBeginInfo._0_8_ != pVVar2) {
    operator_delete((void *)passBeginInfo._0_8_,passBeginInfo.renderPass.m_internal + 1);
  }
  p_Var7 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)((this->super_TestInstance).m_context)->m_progCollection;
  passBeginInfo._0_8_ = pVVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&passBeginInfo,"frag","");
  cVar35 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var7,(key_type *)&passBeginInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&properties,local_768,local_760,
             *(ProgramBinary **)(cVar35._M_node + 2),0);
  DStack_1c0.m_device = (VkDevice)properties._16_8_;
  DStack_1c0.m_allocator = (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_1c8.m_internal._0_4_ = properties.apiVersion;
  local_1c8.m_internal._4_4_ = properties.driverVersion;
  DStack_1c0.m_deviceIface = (DeviceInterface *)properties._8_8_;
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  if ((VkRenderPass *)passBeginInfo._0_8_ != pVVar2) {
    operator_delete((void *)passBeginInfo._0_8_,passBeginInfo.renderPass.m_internal + 1);
  }
  VVar20.m_internal = local_1a8.m_internal;
  uVar9._4_4_ = uStack_5a4;
  uVar9._0_4_ = local_5a8;
  pVVar25 = Context::getDevice((this->super_TestInstance).m_context);
  pDVar24 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  vertexAttribute.location = 0;
  vertexAttribute.binding = 0;
  vertexAttribute.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexAttribute.offset = 0;
  passBeginInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  passBeginInfo.pNext = (void *)0x0;
  passBeginInfo.renderPass.m_internal = 0x100000000;
  passBeginInfo.framebuffer.m_internal = VVar20.m_internal;
  passBeginInfo.renderArea.offset = (VkOffset2D)((long)"pre_main" + 4);
  passBeginInfo.renderArea.extent.width = 0;
  passBeginInfo.renderArea.extent.height = 0;
  passBeginInfo.clearValueCount = 0x12;
  passBeginInfo.pClearValues = (VkClearValue *)0x0;
  attachmentReference.attachment = 0x13;
  properties.deviceName._20_8_ = &inputAssemblyStateParams;
  inputAssemblyStateParams.flags = 0;
  inputAssemblyStateParams.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  inputAssemblyStateParams.primitiveRestartEnable = 0;
  inputAssemblyStateParams._28_4_ = 0;
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyStateParams._4_4_ = 0;
  inputAssemblyStateParams.pNext = (void *)0x0;
  viewportStateParams.pViewports = (VkViewport *)offsets;
  offsets[0] = 0;
  viewportStateParams.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  scissor.extent.width = 100;
  scissor.extent.height = 100;
  properties.deviceName._36_8_ = &viewportStateParams;
  viewportStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportStateParams.pNext = (void *)0x0;
  viewportStateParams.flags = 0;
  viewportStateParams.viewportCount = 1;
  viewportStateParams.scissorCount = 1;
  auStack_7a0._0_8_ = (DeviceInterface *)0x0;
  local_778 = 0;
  local_788 = (void *)0x0;
  uStack_780 = 0;
  auStack_7a0._8_8_ = (VkDevice)0x0;
  _acStack_790 = (VkAllocationCallbacks *)0x0;
  queueFamilyIndex = DS|L;
  CStack_7a4 = SNORM_INT8;
  uStack_770 = 0x3f800000;
  properties.deviceName._52_8_ = &beginInfo;
  beginInfo.pNext = (void *)0x0;
  beginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  beginInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  beginInfo._4_4_ = 0;
  beginInfo.flags = 0;
  beginInfo._20_4_ = 1;
  local_6a8 = &surface;
  surface.m_pixels.m_cap = 1;
  surface.m_width = 0;
  surface.m_height = 1;
  surface.m_pixels.m_ptr = (void *)0x0;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_4_ = 0x1a;
  HVar12.m_internal =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x100000003;
  local_6a0 = 0;
  uStack_698 = 0;
  properties.apiVersion = 0x1c;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\x02';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName._4_8_ = &passBeginInfo;
  properties.deviceName._12_8_ = &attachmentReference;
  properties.deviceName[0x1c] = '\0';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName._44_8_ = &queueFamilyIndex;
  properties.deviceName[0x3c] = '\0';
  properties.deviceName[0x3d] = '\0';
  properties.deviceName[0x3e] = '\0';
  properties.deviceName[0x3f] = '\0';
  properties.deviceName[0x40] = '\0';
  properties.deviceName[0x41] = '\0';
  properties.deviceName[0x42] = '\0';
  properties.deviceName[0x43] = '\0';
  properties.deviceName._68_8_ = &local_6c8;
  properties.deviceName[0x4c] = '\0';
  properties.deviceName[0x4d] = '\0';
  properties.deviceName[0x4e] = '\0';
  properties.deviceName[0x4f] = '\0';
  properties.deviceName[0x50] = '\0';
  properties.deviceName[0x51] = '\0';
  properties.deviceName[0x52] = '\0';
  properties.deviceName[0x53] = '\0';
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_1_ =
       (undefined1)HVar11.m_internal;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._1_1_ =
       SUB81(HVar11.m_internal,1);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._2_1_ =
       SUB81(HVar11.m_internal,2);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._3_1_ =
       SUB81(HVar11.m_internal,3);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._4_1_ =
       SUB81(HVar11.m_internal,4);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._5_1_ =
       SUB81(HVar11.m_internal,5);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._6_1_ =
       SUB81(HVar11.m_internal,6);
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._7_1_ =
       SUB81(HVar11.m_internal,7);
  properties.deviceName[0x5c] =
       (undefined1)local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal
  ;
  properties.deviceName[0x5d] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._1_1_;
  properties.deviceName[0x5e] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._2_1_;
  properties.deviceName[0x5f] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._3_1_;
  properties.deviceName[0x60] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._4_1_;
  properties.deviceName[0x61] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._5_1_;
  properties.deviceName[0x62] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._6_1_;
  properties.deviceName[99] =
       local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._7_1_;
  properties.deviceName[100] = '\0';
  properties.deviceName[0x65] = '\0';
  properties.deviceName[0x66] = '\0';
  properties.deviceName[0x67] = '\0';
  properties.deviceName[0x6c] = '\0';
  properties.deviceName[0x6d] = '\0';
  properties.deviceName[0x6e] = '\0';
  properties.deviceName[0x6f] = '\0';
  properties.deviceName[0x70] = '\0';
  properties.deviceName[0x71] = '\0';
  properties.deviceName[0x72] = '\0';
  properties.deviceName[0x73] = '\0';
  properties.deviceName[0x74] = '\0';
  properties.deviceName[0x75] = '\0';
  properties.deviceName[0x76] = '\0';
  properties.deviceName[0x77] = '\0';
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       HVar12.m_internal;
  properties.deviceName._84_8_ = uVar9;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&clearValue.depthStencil,pDVar24,pVVar25,
             (VkPipelineCache)0x0,(VkGraphicsPipelineCreateInfo *)&properties,
             (VkAllocationCallbacks *)0x0);
  obj_00 = clearValue.depthStencil;
  DStack_1e0.m_deviceIface = (DeviceInterface *)clearValue._8_8_;
  DStack_1e0.m_device = local_e8;
  DStack_1e0.m_allocator = pVStack_e0;
  pCVar4 = (this->super_TestInstance).m_context;
  dVar22 = Context::getUniversalQueueFamilyIndex(pCVar4);
  pDVar24 = Context::getDeviceInterface(pCVar4);
  pVVar25 = Context::getDevice(pCVar4);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&properties,pDVar24,pVVar25,2,dVar22,
             (VkAllocationCallbacks *)0x0);
  uVar9 = properties._0_8_;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)properties._16_8_;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)properties.deviceName._4_8_;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_4_ =
       properties.apiVersion;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._4_4_ =
       properties.driverVersion;
  local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)properties._8_8_;
  pCVar4 = (this->super_TestInstance).m_context;
  pDVar24 = Context::getDeviceInterface(pCVar4);
  pVVar25 = Context::getDevice(pCVar4);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&properties,pDVar24,pVVar25,(VkCommandPool)uVar9,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  uVar19 = properties.deviceName._4_8_;
  uVar18 = properties._16_8_;
  uVar17 = properties._8_8_;
  attachmentReference.attachment = properties.apiVersion;
  attachmentReference.layout = properties.driverVersion;
  createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&properties,
               (this->super_TestInstance).m_context,40000,2);
  viewportStateParams._16_8_ = properties._16_8_;
  viewportStateParams.pViewports = (VkViewport *)properties.deviceName._4_8_;
  viewportStateParams.sType = properties.apiVersion;
  viewportStateParams._4_4_ = properties.driverVersion;
  viewportStateParams.pNext = (void *)properties._8_8_;
  allocateAndBindMemory
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&properties,
             (this->super_TestInstance).m_context,(VkBuffer)properties._0_8_,(MemoryRequirement)0x1)
  ;
  uVar9 = properties._0_8_;
  beginInfo.flags = 0;
  beginInfo._20_4_ = 0;
  beginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
  beginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
  beginInfo._4_4_ = 0;
  beginInfo.pNext = (void *)0x0;
  VVar23 = (*local_768->_vptr_DeviceInterface[0x49])(local_768,attachmentReference);
  dVar22 = local_68c;
  ::vk::checkResult(VVar23,"vk.beginCommandBuffer(*cmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x6b3);
  dVar13 = local_68c;
  pDVar24 = local_768;
  clearValue._0_4_ = 0.125;
  clearValue._4_4_ = 0x3e800000;
  clearValue._8_8_ = 0x3f8000003f400000;
  passBeginInfo.sType = VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO;
  passBeginInfo.pNext = (void *)0x0;
  passBeginInfo.renderPass.m_internal = HVar11.m_internal;
  passBeginInfo.framebuffer.m_internal = local_188.m_internal;
  passBeginInfo.renderArea.offset.x = 0;
  passBeginInfo.renderArea.offset.y = 0;
  passBeginInfo.renderArea.extent.width = 100;
  passBeginInfo.renderArea.extent.height = 100;
  passBeginInfo.clearValueCount = 1;
  properties.apiVersion = 0x2d;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\x01';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\x02';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  local_68c._0_1_ = (undefined1)dVar22;
  local_68c._1_1_ = SUB41(dVar22,1);
  local_68c._2_1_ = SUB41(dVar22,2);
  local_68c._3_1_ = SUB41(dVar22,3);
  properties.deviceName[0x10] = (undefined1)local_68c;
  properties.deviceName[0x11] = local_68c._1_1_;
  properties.deviceName[0x12] = local_68c._2_1_;
  properties.deviceName[0x13] = local_68c._3_1_;
  local_68c._0_1_ = (undefined1)dVar22;
  local_68c._1_1_ = SUB41(dVar22,1);
  local_68c._2_1_ = SUB41(dVar22,2);
  local_68c._3_1_ = SUB41(dVar22,3);
  properties.deviceName[0xc] = (undefined1)local_68c;
  properties.deviceName[0xd] = local_68c._1_1_;
  properties.deviceName[0xe] = local_68c._2_1_;
  properties.deviceName[0xf] = local_68c._3_1_;
  properties.deviceName[0x14] = (undefined1)local_618.m_internal;
  properties.deviceName[0x15] = local_618.m_internal._1_1_;
  properties.deviceName[0x16] = local_618.m_internal._2_1_;
  properties.deviceName[0x17] = local_618.m_internal._3_1_;
  properties.deviceName[0x18] = local_618.m_internal._4_1_;
  properties.deviceName[0x19] = local_618.m_internal._5_1_;
  properties.deviceName[0x1a] = local_618.m_internal._6_1_;
  properties.deviceName[0x1b] = local_618.m_internal._7_1_;
  properties.deviceName[0x1c] = '\x01';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x01';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceName[0x2c] = '\x01';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  passBeginInfo.pClearValues = &clearValue;
  local_68c = dVar13;
  (*local_768->_vptr_DeviceInterface[0x6d])
            (local_768,attachmentReference,1,0x8000,0,0,0,0,0,1,&properties);
  (*pDVar24->_vptr_DeviceInterface[0x74])(pDVar24,attachmentReference,&passBeginInfo,0);
  (*pDVar24->_vptr_DeviceInterface[0x4c])(pDVar24,attachmentReference,0,obj_00);
  (*pDVar24->_vptr_DeviceInterface[0x56])
            (pDVar24,attachmentReference,0,CONCAT44(uStack_5a4,local_5a8),0,1,&local_638,0,0);
  offsets[0] = 0;
  (*pDVar24->_vptr_DeviceInterface[0x58])(pDVar24,attachmentReference,0,1,&local_548);
  (*pDVar24->_vptr_DeviceInterface[0x57])(pDVar24,attachmentReference,local_568.m_internal,0,1);
  (*pDVar24->_vptr_DeviceInterface[0x5a])(pDVar24,attachmentReference,6,1,0,0,0);
  (*pDVar24->_vptr_DeviceInterface[0x76])(pDVar24,attachmentReference);
  dVar13 = local_68c;
  properties.apiVersion = 0x2d;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = 0x100;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\b';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\x02';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\x06';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  local_68c._0_1_ = (undefined1)dVar22;
  local_68c._1_1_ = SUB41(dVar22,1);
  local_68c._2_1_ = SUB41(dVar22,2);
  local_68c._3_1_ = SUB41(dVar22,3);
  properties.deviceName[0x10] = (undefined1)local_68c;
  properties.deviceName[0x11] = local_68c._1_1_;
  properties.deviceName[0x12] = local_68c._2_1_;
  properties.deviceName[0x13] = local_68c._3_1_;
  local_68c._0_1_ = (undefined1)dVar22;
  local_68c._1_1_ = SUB41(dVar22,1);
  local_68c._2_1_ = SUB41(dVar22,2);
  local_68c._3_1_ = SUB41(dVar22,3);
  properties.deviceName[0xc] = (undefined1)local_68c;
  properties.deviceName[0xd] = local_68c._1_1_;
  properties.deviceName[0xe] = local_68c._2_1_;
  properties.deviceName[0xf] = local_68c._3_1_;
  properties.deviceName[0x14] = (undefined1)local_618.m_internal;
  properties.deviceName[0x15] = local_618.m_internal._1_1_;
  properties.deviceName[0x16] = local_618.m_internal._2_1_;
  properties.deviceName[0x17] = local_618.m_internal._3_1_;
  properties.deviceName[0x18] = local_618.m_internal._4_1_;
  properties.deviceName[0x19] = local_618.m_internal._5_1_;
  properties.deviceName[0x1a] = local_618.m_internal._6_1_;
  properties.deviceName[0x1b] = local_618.m_internal._7_1_;
  properties.deviceName[0x1c] = '\x01';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  properties.deviceName[0x24] = '\x01';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceName[0x2c] = '\x01';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  local_68c = dVar13;
  (*pDVar24->_vptr_DeviceInterface[0x6d])
            (pDVar24,attachmentReference,0x8000,0x1000,0,0,0,0,0,1,&properties);
  properties.deviceName[0xc] = '\0';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x10] = '\0';
  properties.deviceName[0x11] = '\0';
  properties.deviceName[0x12] = '\0';
  properties.deviceName[0x13] = '\0';
  properties.deviceName[0x14] = '\0';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = 'd';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_INTEGRATED_GPU;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\x01';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  properties.apiVersion = 0;
  properties.driverVersion = 0;
  properties.vendorID = 100;
  properties.deviceID = 100;
  properties.deviceName[0x1c] = 'd';
  properties.deviceName[0x1d] = '\0';
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\x01';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  (*pDVar24->_vptr_DeviceInterface[99])
            (pDVar24,attachmentReference,local_618.m_internal,6,viewportStateParams._0_8_,1,
             &properties);
  dVar13 = local_68c;
  properties.apiVersion = 0x2c;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceType = 0x1000;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = ' ';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  local_68c._0_1_ = (undefined1)dVar22;
  local_68c._1_1_ = SUB41(dVar22,1);
  local_68c._2_1_ = SUB41(dVar22,2);
  local_68c._3_1_ = SUB41(dVar22,3);
  properties.deviceName[4] = (undefined1)local_68c;
  properties.deviceName[5] = local_68c._1_1_;
  properties.deviceName[6] = local_68c._2_1_;
  properties.deviceName[7] = local_68c._3_1_;
  local_68c._0_1_ = (undefined1)dVar22;
  local_68c._1_1_ = SUB41(dVar22,1);
  local_68c._2_1_ = SUB41(dVar22,2);
  local_68c._3_1_ = SUB41(dVar22,3);
  properties.deviceName[8] = (undefined1)local_68c;
  properties.deviceName[9] = local_68c._1_1_;
  properties.deviceName[10] = local_68c._2_1_;
  properties.deviceName[0xb] = local_68c._3_1_;
  properties.deviceName._12_8_ = viewportStateParams._0_8_;
  properties.deviceName[0x14] = '\0';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\0';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName[0x1c] = '@';
  properties.deviceName[0x1d] = -100;
  properties.deviceName[0x1e] = '\0';
  properties.deviceName[0x1f] = '\0';
  properties.deviceName[0x20] = '\0';
  properties.deviceName[0x21] = '\0';
  properties.deviceName[0x22] = '\0';
  properties.deviceName[0x23] = '\0';
  local_68c = dVar13;
  (*pDVar24->_vptr_DeviceInterface[0x6d])
            (pDVar24,attachmentReference,0x1000,0x4000,0,0,0,1,&properties,0,0);
  VVar23 = (*pDVar24->_vptr_DeviceInterface[0x4a])(pDVar24,attachmentReference);
  ::vk::checkResult(VVar23,"vk.endCommandBuffer(*cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x72e);
  pVVar25 = local_760;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&properties,pDVar24,local_760,0,
                    (VkAllocationCallbacks *)0x0);
  uVar16 = properties._0_8_;
  auStack_7a0._8_8_ = properties._16_8_;
  acStack_78c[0] = properties.deviceName[8];
  acStack_78c[1] = properties.deviceName[9];
  acStack_78c[2] = properties.deviceName[10];
  acStack_78c[3] = properties.deviceName[0xb];
  acStack_790[0] = properties.deviceName[4];
  acStack_790[1] = properties.deviceName[5];
  acStack_790[2] = properties.deviceName[6];
  acStack_790[3] = properties.deviceName[7];
  queueFamilyIndex = properties.apiVersion;
  CStack_7a4 = properties.driverVersion;
  auStack_7a0._0_4_ = properties.vendorID;
  auStack_7a0._4_4_ = properties.deviceID;
  properties.vendorID = 0;
  properties.deviceID = 0;
  properties.deviceName[0xc] = '\0';
  properties.deviceName[0xd] = '\0';
  properties.deviceName[0xe] = '\0';
  properties.deviceName[0xf] = '\0';
  properties.deviceName[0x10] = '\0';
  properties.deviceName[0x11] = '\0';
  properties.deviceName[0x12] = '\0';
  properties.deviceName[0x13] = '\0';
  properties.deviceName[0x24] = '\0';
  properties.deviceName[0x25] = '\0';
  properties.deviceName[0x26] = '\0';
  properties.deviceName[0x27] = '\0';
  properties.deviceName[0x28] = '\0';
  properties.deviceName[0x29] = '\0';
  properties.deviceName[0x2a] = '\0';
  properties.deviceName[0x2b] = '\0';
  properties.deviceType = VK_PHYSICAL_DEVICE_TYPE_OTHER;
  properties.deviceName[0] = '\0';
  properties.deviceName[1] = '\0';
  properties.deviceName[2] = '\0';
  properties.deviceName[3] = '\0';
  properties.deviceName[4] = '\0';
  properties.deviceName[5] = '\0';
  properties.deviceName[6] = '\0';
  properties.deviceName[7] = '\0';
  properties.deviceName[8] = '\0';
  properties.deviceName[9] = '\0';
  properties.deviceName[10] = '\0';
  properties.deviceName[0xb] = '\0';
  properties.deviceName[0x2c] = '\0';
  properties.deviceName[0x2d] = '\0';
  properties.deviceName[0x2e] = '\0';
  properties.deviceName[0x2f] = '\0';
  properties.deviceName[0x30] = '\0';
  properties.deviceName[0x31] = '\0';
  properties.deviceName[0x32] = '\0';
  properties.deviceName[0x33] = '\0';
  properties.apiVersion = 4;
  properties.driverVersion = 0;
  properties.deviceName[0x14] = '\x01';
  properties.deviceName[0x15] = '\0';
  properties.deviceName[0x16] = '\0';
  properties.deviceName[0x17] = '\0';
  properties.deviceName[0x18] = '\0';
  properties.deviceName[0x19] = '\0';
  properties.deviceName[0x1a] = '\0';
  properties.deviceName[0x1b] = '\0';
  properties.deviceName._28_8_ = &attachmentReference;
  VVar23 = (*pDVar24->_vptr_DeviceInterface[2])(pDVar24,local_5b0,1,&properties,uVar16);
  ::vk::checkResult(VVar23,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x741);
  VVar23 = (*pDVar24->_vptr_DeviceInterface[0x16])
                     (pDVar24,pVVar25,1,&queueFamilyIndex,1,0xffffffffffffffff);
  ::vk::checkResult(VVar23,"vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/ubo/vktUniformBlockCase.cpp"
                    ,0x742);
  if (_queueFamilyIndex != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)auStack_7a0,(VkFence)_queueFamilyIndex);
  }
  tcu::Surface::Surface(&surface,100,100);
  vertexAttribute.location = 8;
  vertexAttribute.binding = 3;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&properties,(TextureFormat *)&vertexAttribute,100,100,1,
             *(void **)(uVar9 + 0x18));
  ::vk::invalidateMappedMemoryRange
            (pDVar24,pVVar25,(VkDeviceMemory)*(deUint64 *)(uVar9 + 8),
             *(VkDeviceSize *)(uVar9 + 0x10),40000);
  inputAssemblyStateParams.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  inputAssemblyStateParams._4_4_ = 3;
  data = (void *)surface.m_pixels.m_cap;
  if (surface.m_pixels.m_cap != 0) {
    data = surface.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&queueFamilyIndex,(TextureFormat *)&inputAssemblyStateParams,
             surface.m_width,surface.m_height,1,data);
  tcu::copy((EVP_PKEY_CTX *)&queueFamilyIndex,(EVP_PKEY_CTX *)&properties);
  if (surface.m_height < 1) {
    iVar39 = 0;
  }
  else {
    iVar41 = 0;
    iVar42 = 0;
    iVar39 = 0;
    do {
      uVar46 = surface._0_8_ & 0xffffffff;
      iVar43 = iVar41;
      if (0 < surface.m_width) {
        do {
          iVar39 = iVar39 + (uint)(*(int *)((long)surface.m_pixels.m_ptr + (long)iVar43 * 4) != -1);
          iVar43 = iVar43 + 1;
          uVar46 = uVar46 - 1;
        } while (uVar46 != 0);
      }
      iVar42 = iVar42 + 1;
      iVar41 = iVar41 + surface.m_width;
    } while (iVar42 != surface.m_height);
  }
  if (iVar39 < 1) {
    properties._0_8_ = &properties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>((string *)&properties,"Full white image ok","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,properties._0_8_,
               properties._8_8_ + properties._0_8_);
  }
  else {
    pTVar8 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
    _queueFamilyIndex = (TextureFormat)((long)auStack_7a0 + 8);
    std::__cxx11::string::_M_construct<char_const*>((string *)&queueFamilyIndex,"Image","");
    inputAssemblyStateParams._0_8_ = &inputAssemblyStateParams.flags;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&inputAssemblyStateParams,"Rendered image","");
    surface_00 = &surface;
    tcu::LogImage::LogImage
              ((LogImage *)&properties,(string *)&queueFamilyIndex,
               (string *)&inputAssemblyStateParams,surface_00,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&properties,(int)pTVar8,__buf,(size_t)surface_00);
    if ((char *)properties.deviceName._12_8_ != properties.deviceName + 0x1c) {
      operator_delete((void *)properties.deviceName._12_8_,properties.deviceName._28_8_ + 1);
    }
    if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
      operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
    }
    if ((VkPipelineInputAssemblyStateCreateFlags *)inputAssemblyStateParams._0_8_ !=
        &inputAssemblyStateParams.flags) {
      operator_delete((void *)inputAssemblyStateParams._0_8_,inputAssemblyStateParams._16_8_ + 1);
    }
    if (_queueFamilyIndex != (TextureFormat)((long)auStack_7a0 + 8)) {
      operator_delete((void *)_queueFamilyIndex,(ulong)(auStack_7a0._8_8_ + 1));
    }
    pdVar3 = &properties.vendorID;
    properties._0_8_ = pTVar8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pdVar3,"Image comparison failed, got ",0x1d);
    std::ostream::operator<<(pdVar3,iVar39);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar3," non-white pixels",0x11);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
    std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
    pBVar40 = (this->m_layout->blocks).
              super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->m_layout->blocks).
        super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish != pBVar40) {
      pdVar3 = &properties.vendorID;
      lVar44 = 0;
      uVar46 = 0;
      do {
        properties._0_8_ = pTVar8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar3,"Block index: ",0xd);
        std::ostream::_M_insert<unsigned_long>((ulong)pdVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar3," infos: ",8);
        ubo::operator<<((ostream *)pdVar3,
                        (BlockLayoutEntry *)((long)&(pBVar40->name)._M_dataplus._M_p + lVar44));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
        std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
        uVar46 = uVar46 + 1;
        pBVar40 = (this->m_layout->blocks).
                  super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar44 = lVar44 + 0x50;
      } while (uVar46 < (ulong)(((long)(this->m_layout->blocks).
                                       super__Vector_base<vkt::ubo::BlockLayoutEntry,_std::allocator<vkt::ubo::BlockLayoutEntry>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar40 >>
                                4) * -0x3333333333333333));
    }
    if ((this->m_layout->uniforms).
        super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_layout->uniforms).
        super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pdVar3 = &properties.vendorID;
      lVar44 = 0;
      uVar46 = 0;
      do {
        properties._0_8_ = pTVar8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar3,"Uniform index: ",0xf);
        std::ostream::_M_insert<unsigned_long>((ulong)pdVar3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pdVar3," infos: ",8);
        ubo::operator<<((ostream *)pdVar3,
                        (UniformLayoutEntry *)
                        ((long)&(((this->m_layout->uniforms).
                                  super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->name)._M_dataplus._M_p
                        + lVar44));
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&properties,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar3);
        std::ios_base::~ios_base((ios_base *)(properties.deviceName + 100));
        uVar46 = uVar46 + 1;
        lVar44 = lVar44 + 0x40;
      } while (uVar46 < (ulong)((long)(this->m_layout->uniforms).
                                      super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->m_layout->uniforms).
                                      super__Vector_base<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 6));
    }
    properties._0_8_ = &properties.deviceType;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&properties,"Detected non-white pixels","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,properties._0_8_,
               properties._8_8_ + properties._0_8_);
  }
  if ((VkPhysicalDeviceType *)properties._0_8_ != &properties.deviceType) {
    operator_delete((void *)properties._0_8_,properties._16_8_ + 1);
  }
  tcu::Surface::~Surface(&surface);
  if (uVar9 != 0) {
    (**(code **)(*(long *)uVar9 + 8))(uVar9);
  }
  if (viewportStateParams._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)8>_> *)&viewportStateParams.pNext,
               (VkBuffer)viewportStateParams._0_8_);
  }
  if (attachmentReference != (VkAttachmentReference)0x0) {
    properties.apiVersion = attachmentReference.attachment;
    properties.driverVersion = attachmentReference.layout;
    (**(code **)(*(long *)uVar17 + 0x240))(uVar17,uVar18,uVar19,1);
  }
  if (local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)
               &local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkCommandPool)
               local_6c8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  if ((VkClearDepthStencilValue)obj_00 != (VkClearDepthStencilValue)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&DStack_1e0,(VkPipeline)obj_00);
  }
  if (local_1c8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_1c0,local_1c8);
  }
  if (local_1a8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_1a0,local_1a8);
  }
  obj.m_internal._4_4_ = uStack_5a4;
  obj.m_internal._0_4_ = local_5a8;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_5a0,obj);
  }
  if (local_188.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_180,local_188);
  }
  if (HVar11.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_5d0,(VkRenderPass)HVar11.m_internal);
  }
  if (descriptors.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(descriptors.
                    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)descriptors.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)descriptors.
                          super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_638 != 0) {
    properties.apiVersion = (undefined4)local_638;
    properties.driverVersion = local_638._4_4_;
    (**(code **)(*plStack_630 + 0x1e8))(plStack_630,_local_628,acStack_620,1);
  }
  if (local_168.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()(&DStack_160,local_168);
  }
  if (local_588 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)19>_>::operator()
              (&DStack_580,(VkDescriptorSetLayout)local_588);
  }
  if (local_148 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&DStack_140,(VkImageView)local_148);
  }
  if (uVar10 != 0) {
    (**(code **)(*(long *)uVar10 + 8))();
  }
  if (local_618.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()(&DStack_610,local_618);
  }
  if (uVar15 != 0) {
    (**(code **)(*(long *)uVar15 + 8))(uVar15);
  }
  if (local_568.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_560,local_568);
  }
  if (uVar14 != 0) {
    (**(code **)(*(long *)uVar14 + 8))(uVar14);
  }
  if (local_548.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_540,local_548);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus UniformBlockCaseInstance::iterate (void)
{
	const vk::DeviceInterface&		vk					= m_context.getDeviceInterface();
	const vk::VkDevice				device				= m_context.getDevice();
	const vk::VkQueue				queue				= m_context.getUniversalQueue();
	const deUint32					queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const float positions[] =
	{
		-1.0f, -1.0f, 0.0f, 1.0f,
		-1.0f, +1.0f, 0.0f, 1.0f,
		+1.0f, -1.0f, 0.0f, 1.0f,
		+1.0f, +1.0f, 0.0f, 1.0f
	};

	const deUint32 indices[] = { 0, 1, 2, 2, 1, 3 };

	vk::Unique<VkBuffer>				positionsBuffer		(createBuffer(m_context, sizeof(positions), vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
	de::UniquePtr<Allocation>			positionsAlloc		(allocateAndBindMemory(m_context, *positionsBuffer, MemoryRequirement::HostVisible));
	vk::Unique<VkBuffer>				indicesBuffer		(createBuffer(m_context, sizeof(indices), vk::VK_BUFFER_USAGE_INDEX_BUFFER_BIT|vk::VK_BUFFER_USAGE_VERTEX_BUFFER_BIT));
	de::UniquePtr<Allocation>			indicesAlloc		(allocateAndBindMemory(m_context, *indicesBuffer, MemoryRequirement::HostVisible));

	int minUniformBufferOffsetAlignment = getminUniformBufferOffsetAlignment(m_context);

	// Upload attrbiutes data
	{
		deMemcpy(positionsAlloc->getHostPtr(), positions, sizeof(positions));
		flushMappedMemoryRange(vk, device, positionsAlloc->getMemory(), positionsAlloc->getOffset(), sizeof(positions));

		deMemcpy(indicesAlloc->getHostPtr(), indices, sizeof(indices));
		flushMappedMemoryRange(vk, device, indicesAlloc->getMemory(), indicesAlloc->getOffset(), sizeof(indices));
	}

	vk::Unique<VkImage>					colorImage			(createImage2D(m_context,
																			RENDER_WIDTH,
																			RENDER_HEIGHT,
																			vk::VK_FORMAT_R8G8B8A8_UNORM,
																			vk::VK_IMAGE_TILING_OPTIMAL,
																			vk::VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT|vk::VK_IMAGE_USAGE_TRANSFER_SRC_BIT));
	de::UniquePtr<Allocation>			colorImageAlloc		(allocateAndBindMemory(m_context, *colorImage, MemoryRequirement::Any));
	vk::Unique<VkImageView>				colorImageView		(createAttachmentView(m_context, *colorImage, vk::VK_FORMAT_R8G8B8A8_UNORM));

	vk::Unique<VkDescriptorSetLayout>	descriptorSetLayout	(createDescriptorSetLayout());
	vk::Unique<VkDescriptorPool>		descriptorPool		(createDescriptorPool());

	const VkDescriptorSetAllocateInfo	descriptorSetAllocateInfo =
	{
		VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,		// VkStructureType				sType;
		DE_NULL,											// const void*					pNext;
		*descriptorPool,									// VkDescriptorPool				descriptorPool;
		1u,													// deUint32						setLayoutCount;
		&descriptorSetLayout.get()							// const VkDescriptorSetLayout*	pSetLayouts;
	};

	vk::Unique<VkDescriptorSet>			descriptorSet(vk::allocateDescriptorSet(vk, device, &descriptorSetAllocateInfo));
	int									numBlocks = (int)m_layout.blocks.size();
	std::vector<vk::VkDescriptorBufferInfo>	descriptors(numBlocks);

	// Upload uniform data
	{
		vk::DescriptorSetUpdateBuilder	descriptorSetUpdateBuilder;

		if (m_bufferMode == UniformBlockCase::BUFFERMODE_PER_BLOCK)
		{
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const BlockLayoutEntry& block = m_layout.blocks[blockNdx];
				const void*	srcPtr = m_blockPointers.find(blockNdx)->second;

				descriptors[blockNdx] = addUniformData(block.size, srcPtr);
				descriptorSetUpdateBuilder.writeSingle(*descriptorSet, vk::DescriptorSetUpdateBuilder::Location::bindingArrayElement(block.bindingNdx, block.instanceNdx),
														VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER, &descriptors[blockNdx]);
			}
		}
		else
		{
			int currentOffset = 0;
			std::map<int, int> offsets;
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				if (minUniformBufferOffsetAlignment > 0)
					currentOffset = deAlign32(currentOffset, minUniformBufferOffsetAlignment);
				offsets[blockNdx] = currentOffset;
				currentOffset += m_layout.blocks[blockNdx].size;
			}

			deUint32 totalSize = currentOffset;

			// Make a copy of the data that satisfies the device's min uniform buffer alignment
			std::vector<deUint8> data;
			data.resize(totalSize);
			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				deMemcpy(&data[offsets[blockNdx]], m_blockPointers.find(blockNdx)->second, m_layout.blocks[blockNdx].size);
			}

			vk::VkBuffer buffer = addUniformData(totalSize, &data[0]).buffer;

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const BlockLayoutEntry& block = m_layout.blocks[blockNdx];
				deUint32 size = block.size;

				const VkDescriptorBufferInfo	descriptor =
				{
					buffer,							// VkBuffer		buffer;
					(deUint32)offsets[blockNdx],	// VkDeviceSize	offset;
					size,							// VkDeviceSize	range;
				};

				descriptors[blockNdx] = descriptor;
				descriptorSetUpdateBuilder.writeSingle(*descriptorSet,
														vk::DescriptorSetUpdateBuilder::Location::bindingArrayElement(block.bindingNdx, block.instanceNdx),
														VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
														&descriptors[blockNdx]);
			}
		}

		descriptorSetUpdateBuilder.update(vk, device);
	}

	vk::Unique<VkRenderPass>			renderPass			(createRenderPass(vk::VK_FORMAT_R8G8B8A8_UNORM));
	vk::Unique<VkFramebuffer>			framebuffer			(createFramebuffer(*renderPass, *colorImageView));
	vk::Unique<VkPipelineLayout>		pipelineLayout		(createPipelineLayout(m_context, *descriptorSetLayout));

	vk::Unique<VkShaderModule>			vtxShaderModule		(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("vert"), 0));
	vk::Unique<VkShaderModule>			fragShaderModule	(vk::createShaderModule(vk, device, m_context.getBinaryCollection().get("frag"), 0));
	vk::Unique<VkPipeline>				pipeline			(createPipeline(*vtxShaderModule, *fragShaderModule, *pipelineLayout, *renderPass));
	vk::Unique<VkCommandPool>			cmdPool				(createCmdPool(m_context));
	vk::Unique<VkCommandBuffer>			cmdBuffer			(createCmdBuffer(m_context, *cmdPool));
	vk::Unique<VkBuffer>				readImageBuffer		(createBuffer(m_context, (vk::VkDeviceSize)(RENDER_WIDTH * RENDER_HEIGHT * 4), vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT));
	de::UniquePtr<Allocation>			readImageAlloc		(allocateAndBindMemory(m_context, *readImageBuffer, vk::MemoryRequirement::HostVisible));

	// Record command buffer
	const vk::VkCommandBufferBeginInfo beginInfo	=
	{
		vk::VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,											// const void*						pNext;
		0u,													// VkCommandBufferUsageFlags		flags;
		(const vk::VkCommandBufferInheritanceInfo*)DE_NULL,
	};
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &beginInfo));

	const vk::VkClearValue clearValue = vk::makeClearValueColorF32(0.125f, 0.25f, 0.75f, 1.0f);
	const vk::VkRenderPassBeginInfo passBeginInfo	=
	{
		vk::VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,	// VkStructureType		sType;
		DE_NULL,										// const void*			pNext;
		*renderPass,									// VkRenderPass			renderPass;
		*framebuffer,									// VkFramebuffer		framebuffer;
		{ { 0, 0 }, { RENDER_WIDTH, RENDER_HEIGHT } },	// VkRect2D				renderArea;
		1u,												// deUint32				clearValueCount;
		&clearValue,									// const VkClearValue*	pClearValues;
	};

	// Add barrier for initializing image state
	{
		const vk::VkImageMemoryBarrier  initializeBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
			DE_NULL,										// const void*				pNext
			0,												// VVkAccessFlags			srcAccessMask;
			vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			vk::VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout			oldLayout;
			vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			queueFamilyIndex,								// deUint32					srcQueueFamilyIndex;
			queueFamilyIndex,								// deUint32					dstQueueFamilyIndex;
			*colorImage,									// VkImage					image;
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,			// VkImageAspectFlags	aspectMask;
				0u,										// deUint32				baseMipLevel;
				1u,										// deUint32				mipLevels;
				0u,										// deUint32				baseArraySlice;
				1u,										// deUint32				arraySize;
			}												// VkImageSubresourceRange	subresourceRange
		};

		vk.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, (vk::VkDependencyFlags)0,
			0, (const vk::VkMemoryBarrier*)DE_NULL,
			0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
			1, &initializeBarrier);
	}

	vk.cmdBeginRenderPass(*cmdBuffer, &passBeginInfo, vk::VK_SUBPASS_CONTENTS_INLINE);

	vk.cmdBindPipeline(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	vk.cmdBindDescriptorSets(*cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *pipelineLayout, 0u, 1u, &*descriptorSet, 0u, DE_NULL);

	const vk::VkDeviceSize offsets[] = { 0u };
	vk.cmdBindVertexBuffers(*cmdBuffer, 0u, 1u, &*positionsBuffer, offsets);
	vk.cmdBindIndexBuffer(*cmdBuffer, *indicesBuffer, (vk::VkDeviceSize)0, vk::VK_INDEX_TYPE_UINT32);

	vk.cmdDrawIndexed(*cmdBuffer, DE_LENGTH_OF_ARRAY(indices), 1u, 0u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuffer);

	// Add render finish barrier
	{
		const vk::VkImageMemoryBarrier  renderFinishBarrier =
		{
			vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// VkStructureType			sType;
			DE_NULL,										// const void*				pNext
			vk::VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// VVkAccessFlags			srcAccessMask;
			vk::VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags			dstAccessMask;
			vk::VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// VkImageLayout			oldLayout;
			vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// VkImageLayout			newLayout;
			queueFamilyIndex,								// deUint32					srcQueueFamilyIndex;
			queueFamilyIndex,								// deUint32					dstQueueFamilyIndex;
			*colorImage,									// VkImage					image;
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,			// VkImageAspectFlags	aspectMask;
				0u,										// deUint32				baseMipLevel;
				1u,										// deUint32				mipLevels;
				0u,										// deUint32				baseArraySlice;
				1u,										// deUint32				arraySize;
			}												// VkImageSubresourceRange	subresourceRange
		};

		vk.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, (vk::VkDependencyFlags)0,
							  0, (const vk::VkMemoryBarrier*)DE_NULL,
							  0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
							  1, &renderFinishBarrier);
	}

	// Add Image->Buffer copy command
	{
		const vk::VkBufferImageCopy copyParams =
		{
			(vk::VkDeviceSize)0u,					// VkDeviceSize				bufferOffset;
			(deUint32)RENDER_WIDTH,					// deUint32					bufferRowLength;
			(deUint32)RENDER_HEIGHT,				// deUint32					bufferImageHeight;
			{
				vk::VK_IMAGE_ASPECT_COLOR_BIT,	// VkImageAspect	aspect;
				0u,								// deUint32			mipLevel;
				0u,								// deUint32			arrayLayer;
				1u,								// deUint32			arraySize;
			},										// VkImageSubresourceCopy	imageSubresource
			{ 0u, 0u, 0u },							// VkOffset3D				imageOffset;
			{ RENDER_WIDTH, RENDER_HEIGHT, 1u }		// VkExtent3D				imageExtent;
		};

		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorImage, vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *readImageBuffer, 1u, &copyParams);
	}

	// Add copy finish barrier
	{
		const vk::VkBufferMemoryBarrier copyFinishBarrier	=
		{
			vk::VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,		// VkStructureType		sType;
			DE_NULL,											// const void*			pNext;
			VK_ACCESS_TRANSFER_WRITE_BIT,						// VkAccessFlags		srcAccessMask;
			VK_ACCESS_HOST_READ_BIT,							// VkAccessFlags		dstAccessMask;
			queueFamilyIndex,									// deUint32				srcQueueFamilyIndex;
			queueFamilyIndex,									// deUint32				destQueueFamilyIndex;
			*readImageBuffer,									// VkBuffer				buffer;
			0u,													// VkDeviceSize			offset;
			(vk::VkDeviceSize)(RENDER_WIDTH * RENDER_HEIGHT * 4)// VkDeviceSize			size;
		};

		vk.cmdPipelineBarrier(*cmdBuffer, vk::VK_PIPELINE_STAGE_TRANSFER_BIT, vk::VK_PIPELINE_STAGE_HOST_BIT, (vk::VkDependencyFlags)0,
							  0, (const vk::VkMemoryBarrier*)DE_NULL,
							  1, &copyFinishBarrier,
							  0, (const vk::VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	// Submit the command buffer
	{
		const Unique<vk::VkFence> fence(vk::createFence(vk, device));

		const VkSubmitInfo			submitInfo	=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,						// const void*				pNext;
			0u,								// deUint32					waitSemaphoreCount;
			DE_NULL,						// const VkSemaphore*		pWaitSemaphores;
			(const VkPipelineStageFlags*)DE_NULL,
			1u,								// deUint32					commandBufferCount;
			&cmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0u,								// deUint32					signalSemaphoreCount;
			DE_NULL							// const VkSemaphore*		pSignalSemaphores;
		};

		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(device, 1u, &fence.get(), DE_TRUE, ~0ull));
	}

	// Read back the results
	tcu::Surface surface(RENDER_WIDTH, RENDER_HEIGHT);
	{
		const tcu::TextureFormat textureFormat(tcu::TextureFormat::RGBA, tcu::TextureFormat::UNORM_INT8);
		const tcu::ConstPixelBufferAccess imgAccess(textureFormat, RENDER_WIDTH, RENDER_HEIGHT, 1, readImageAlloc->getHostPtr());
		const vk::VkDeviceSize bufferSize = RENDER_WIDTH * RENDER_HEIGHT * 4;
		invalidateMappedMemoryRange(vk, device, readImageAlloc->getMemory(), readImageAlloc->getOffset(), bufferSize);

		tcu::copy(surface.getAccess(), imgAccess);
	}

	// Check if the result image is all white
	tcu::RGBA white(tcu::RGBA::white());
	int numFailedPixels = 0;

	for (int y = 0; y < surface.getHeight(); y++)
	{
		for (int x = 0; x < surface.getWidth(); x++)
		{
			if (surface.getPixel(x, y) != white)
				numFailedPixels += 1;
		}
	}

	if (numFailedPixels > 0)
	{
		tcu::TestLog& log = m_context.getTestContext().getLog();
		log << tcu::TestLog::Image("Image", "Rendered image", surface);
		log << tcu::TestLog::Message << "Image comparison failed, got " << numFailedPixels << " non-white pixels" << tcu::TestLog::EndMessage;

		for (size_t blockNdx = 0; blockNdx < m_layout.blocks.size(); blockNdx++)
		{
			const BlockLayoutEntry& block = m_layout.blocks[blockNdx];
			log << tcu::TestLog::Message << "Block index: " << blockNdx << " infos: " << block << tcu::TestLog::EndMessage;
		}

		for (size_t uniformNdx = 0; uniformNdx < m_layout.uniforms.size(); uniformNdx++)
		{
			log << tcu::TestLog::Message << "Uniform index: " << uniformNdx << " infos: " << m_layout.uniforms[uniformNdx] << tcu::TestLog::EndMessage;
		}

		return tcu::TestStatus::fail("Detected non-white pixels");
	}
	else
		return tcu::TestStatus::pass("Full white image ok");
}